

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O2

void density::f_destroy::invoke<density_tests::SingleDerivedNonPoly>(void *i_object)

{
  density_tests::InstanceCounted::~InstanceCounted((InstanceCounted *)((long)i_object + 0x48));
  std::__cxx11::string::~string((string *)((long)i_object + 0x28));
  std::__cxx11::string::~string((string *)((long)i_object + 8));
  density_tests::NonPolymorphicBase::~NonPolymorphicBase((NonPolymorphicBase *)i_object);
  return;
}

Assistant:

static void invoke(void * i_object) noexcept
        {
            DENSITY_ASSUME(i_object != nullptr);
            TARGET_TYPE * obj = static_cast<TARGET_TYPE *>(i_object);
            static_assert(
              noexcept(obj->TARGET_TYPE::~TARGET_TYPE()),
              "TARGET_TYPE must be nothrow destructible");
            obj->TARGET_TYPE::~TARGET_TYPE();
        }